

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O0

void build_state_for(Grammar *g,State *s,Elem *e)

{
  Item *i_00;
  Elem *e_00;
  State *ss_00;
  State *local_38;
  State *ss;
  Item *i;
  uint j;
  Elem *e_local;
  State *s_local;
  Grammar *g_local;
  
  local_38 = (State *)0x0;
  for (i._4_4_ = 0; i._4_4_ < (s->items).n; i._4_4_ = i._4_4_ + 1) {
    i_00 = (s->items).v[i._4_4_];
    if (((i_00->kind != ELEM_END) && (i_00->kind == e->kind)) && ((i_00->e).nterm == (e->e).nterm))
    {
      if (local_38 == (State *)0x0) {
        local_38 = new_state();
      }
      e_00 = next_elem(i_00);
      insert_item(local_38,e_00);
    }
  }
  if (local_38 != (State *)0x0) {
    ss_00 = build_closure(g,local_38);
    add_goto(s,ss_00,e);
  }
  return;
}

Assistant:

static void build_state_for(Grammar *g, State *s, Elem *e) {
  uint j;
  Item *i;
  State *ss = NULL;

  for (j = 0; j < s->items.n; j++) {
    i = s->items.v[j];
    if (i->kind != ELEM_END && i->kind == e->kind && i->e.term_or_nterm == e->e.term_or_nterm) {
      if (!ss) ss = new_state();
      insert_item(ss, next_elem(i));
    }
  }
  if (ss) add_goto(s, build_closure(g, ss), e);
}